

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasn1element.cpp
# Opt level: O1

QAsn1Element * QAsn1Element::fromInteger(QAsn1Element *__return_storage_ptr__,uint val)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  
  uVar3 = (ulong)val;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)__return_storage_ptr__ = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->mValue).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->mValue).d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->mValue).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->mType = '\x02';
  (__return_storage_ptr__->mValue).d.d = (Data *)0x0;
  (__return_storage_ptr__->mValue).d.ptr = (char *)0x0;
  (__return_storage_ptr__->mValue).d.size = 0;
  if (0x7f < val) {
    do {
      QByteArray::insert((longlong)&__return_storage_ptr__->mValue,
                         (QByteArrayView)(ZEXT816(1) << 0x40));
      uVar2 = (uint)uVar3;
      uVar3 = uVar3 >> 8;
    } while (0x7fff < uVar2);
  }
  QByteArray::insert((longlong)&__return_storage_ptr__->mValue,(QByteArrayView)(ZEXT816(1) << 0x40))
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QAsn1Element QAsn1Element::fromInteger(unsigned int val)
{
    QAsn1Element elem(QAsn1Element::IntegerType);
    while (val > 127) {
        elem.mValue.prepend(val & 0xff);
        val >>= 8;
    }
    elem.mValue.prepend(val & 0x7f);
    return elem;
}